

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,StringPtr *row,uint skip)

{
  size_t *psVar1;
  uint uVar2;
  StringPtr *pSVar3;
  uchar *__s2;
  size_t sVar4;
  HashBucket *pHVar5;
  size_t sVar6;
  bool bVar7;
  uint hash;
  uint uVar8;
  int iVar9;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar10;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  ulong uVar11;
  long lVar12;
  ulong targetSize;
  Maybe<unsigned_long> *result;
  HashBucket *s;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar13;
  size_t sVar14;
  Maybe<unsigned_long> MVar15;
  ArrayPtr<const_unsigned_char> s_00;
  
  if (skip != 0) {
    pSVar3 = (table->rows).builder.ptr;
    lVar12 = (long)(table->rows).builder.pos - (long)pSVar3;
    __s2 = (uchar *)(row->content).ptr;
    sVar4 = (row->content).size_;
    uVar11 = (table->indexes).buckets.size_ * 2;
    if (uVar11 < ((lVar12 >> 4) + (table->indexes).erasedCount) * 3 + 3) {
      targetSize = (lVar12 >> 3) + 2;
      if (targetSize < uVar11) {
        targetSize = uVar11;
      }
      HashIndex<kj::_::(anonymous_namespace)::StringHasher>::rehash(&table->indexes,targetSize);
    }
    s_00.size_ = sVar4 - 1;
    s_00.ptr = __s2;
    hash = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s_00);
    uVar8 = _::chooseBucket(hash,(uint)(table->indexes).buckets.size_);
    pHVar5 = (table->indexes).buckets.ptr;
    sVar6 = (table->indexes).buckets.size_;
    paVar13 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
LAB_0014585a:
    paVar10 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(pHVar5 + uVar8);
    uVar2 = *(uint *)((long)paVar10 + 4);
    uVar11 = (ulong)uVar2;
    if (uVar2 == 1) {
      if (paVar13 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar13 = paVar10;
      }
    }
    else {
      if (uVar2 == 0) {
        if (paVar13 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          psVar1 = &(table->indexes).erasedCount;
          *psVar1 = *psVar1 - 1;
          paVar10 = paVar13;
        }
        pos = ((ulong)hash | pos << 0x20) + 0x200000000;
        paVar10->value = pos;
        bVar7 = false;
        goto LAB_001458ed;
      }
      if (*(uint *)paVar10 == hash) {
        uVar11 = (ulong)(uVar2 - 2);
        sVar14 = pSVar3[uVar11].content.size_;
        if ((sVar14 == sVar4) &&
           (iVar9 = bcmp(pSVar3[uVar11].content.ptr,__s2,sVar14 - 1), iVar9 == 0))
        goto LAB_00145919;
      }
    }
    sVar14 = (ulong)uVar8 + 1;
    uVar8 = (uint)sVar14;
    if (sVar14 == sVar6) {
      uVar8 = 0;
    }
    goto LAB_0014585a;
  }
  *this = (Impl<0UL,_false>)0x0;
LAB_00145915:
  MVar15.ptr.field_1.value = pos;
  MVar15.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar15.ptr;
LAB_00145919:
  bVar7 = true;
  pos = (size_t)extraout_RDX;
LAB_001458ed:
  if (bVar7) {
    *this = (Impl<0UL,_false>)0x1;
    *(ulong *)(this + 8) = uVar11;
  }
  else {
    *this = (Impl<0UL,_false>)0x0;
  }
  goto LAB_00145915;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_MAYBE(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return *existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == nullptr;
    return result;
  }